

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O2

void av1_highbd_iwht4x4_1_add_c(tran_low_t *in,uint8_t *dest8,int dest_stride,int bd)

{
  long lVar1;
  long lVar2;
  uint16_t uVar3;
  tran_low_t *op;
  long lVar4;
  uint16_t *puVar5;
  int iVar6;
  long trans;
  tran_low_t tmp [4];
  int local_58 [6];
  long local_40;
  long local_38;
  
  puVar5 = (uint16_t *)((long)dest8 * 2);
  local_58[3] = *in >> 3;
  local_58[0] = (*in >> 2) - local_58[3];
  local_58[2] = local_58[3];
  local_58[1] = local_58[3];
  local_40 = (long)(dest_stride * 2);
  local_38 = (long)dest_stride;
  for (lVar4 = 0; (int)lVar4 != 0x10; lVar4 = lVar4 + 4) {
    iVar6 = *(int *)((long)local_58 + lVar4) >> 1;
    uVar3 = highbd_clip_pixel_add(*puVar5,(long)(*(int *)((long)local_58 + lVar4) - iVar6),bd);
    lVar2 = local_38;
    *puVar5 = uVar3;
    trans = (long)iVar6;
    uVar3 = highbd_clip_pixel_add(puVar5[local_38],trans,bd);
    lVar1 = local_40;
    puVar5[lVar2] = uVar3;
    uVar3 = highbd_clip_pixel_add(puVar5[local_40],trans,bd);
    puVar5[lVar1] = uVar3;
    uVar3 = highbd_clip_pixel_add(puVar5[dest_stride * 3],trans,bd);
    puVar5[dest_stride * 3] = uVar3;
    puVar5 = puVar5 + 1;
  }
  return;
}

Assistant:

void av1_highbd_iwht4x4_1_add_c(const tran_low_t *in, uint8_t *dest8,
                                int dest_stride, int bd) {
  int i;
  tran_low_t a1, e1;
  tran_low_t tmp[4];
  const tran_low_t *ip = in;
  tran_low_t *op = tmp;
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);
  (void)bd;

  a1 = ip[0 * 4] >> UNIT_QUANT_SHIFT;
  e1 = a1 >> 1;
  a1 -= e1;
  op[0] = a1;
  op[1] = op[2] = op[3] = e1;

  ip = tmp;
  for (i = 0; i < 4; i++) {
    e1 = ip[0] >> 1;
    a1 = ip[0] - e1;
    dest[dest_stride * 0] =
        highbd_clip_pixel_add(dest[dest_stride * 0], a1, bd);
    dest[dest_stride * 1] =
        highbd_clip_pixel_add(dest[dest_stride * 1], e1, bd);
    dest[dest_stride * 2] =
        highbd_clip_pixel_add(dest[dest_stride * 2], e1, bd);
    dest[dest_stride * 3] =
        highbd_clip_pixel_add(dest[dest_stride * 3], e1, bd);
    ip++;
    dest++;
  }
}